

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm4x8CaseInstance *this)

{
  float *pfVar1;
  undefined8 uVar2;
  ShaderExecutor *pSVar3;
  float fVar4;
  float fVar5;
  deUint32 dVar6;
  pointer puVar7;
  pointer puVar8;
  ulong uVar9;
  int iVar10;
  TestStatus *pTVar11;
  int iVar12;
  Hex<8UL> hex;
  long lVar13;
  long lVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar27;
  undefined1 auVar26 [16];
  float fVar28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  HexFloat local_25c;
  HexFloat local_258;
  HexFloat local_254;
  HexFloat local_250;
  HexFloat local_24c;
  HexFloat local_248;
  HexFloat local_244;
  TestStatus *local_240;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0x776002);
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in = (void *)((ulong)in._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x7fff8000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x80007fff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x1fffe);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  iVar12 = 0x5f;
  while (bVar15 = iVar12 != 0, iVar12 = iVar12 + -1, bVar15) {
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    in = (void *)CONCAT44(in._4_4_,dVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&inputs,(uint *)&in);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&outputs,(long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_240 = __return_storage_ptr__;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  iVar12 = 0;
  (*pSVar3->_vptr_ShaderExecutor[2])
            (pSVar3,(ulong)((long)inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,&in,&out,0);
  uVar9 = (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar14 = 8;
  puVar7 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar13 = 0; lVar13 < (int)((ulong)((long)puVar8 - (long)puVar7) >> 2); lVar13 = lVar13 + 1) {
    uVar17 = puVar7[lVar13];
    auVar21._0_4_ = (float)((int)(uVar17 << 0x10) >> 0x18);
    auVar21._4_4_ = (float)(int)((long)((ulong)(ushort)(uVar17 << 8) << 0x30) >> 0x38);
    auVar21._8_8_ = 0;
    auVar21 = divps(auVar21,ZEXT816(0x42fe000042fe0000));
    auVar22 = minps(ZEXT816(0x3f8000003f800000),auVar21);
    uVar16 = -(uint)(auVar21._0_4_ < -1.0);
    uVar18 = -(uint)(auVar21._4_4_ < -1.0);
    cVar20 = (char)(uVar17 >> 0x10);
    auVar26._0_4_ = (float)(int)cVar20;
    auVar26._4_4_ = (float)((int)uVar17 >> 0x18);
    auVar26._8_4_ = (float)(int)cVar20;
    auVar26._12_4_ = (float)(int)(char)(uVar17 >> 0x18);
    auVar26 = divps(auVar26,ZEXT816(0x42fe000042fe0000));
    auVar21 = minps(ZEXT816(0x3f8000003f800000),auVar26);
    uVar17 = -(uint)(auVar26._0_4_ < -1.0);
    uVar19 = -(uint)(auVar26._4_4_ < -1.0);
    fVar25 = (float)(~uVar17 & auVar21._0_4_ | uVar17 & 0xbf800000);
    fVar27 = (float)(~uVar19 & auVar21._4_4_ | uVar19 & 0xbf800000);
    uVar2 = *(undefined8 *)
             ((long)(outputs.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -8);
    fVar23 = (float)uVar2;
    fVar24 = (float)((ulong)uVar2 >> 0x20);
    pfVar1 = (float *)((long)(outputs.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    fVar4 = *pfVar1;
    fVar5 = pfVar1[1];
    fVar28 = (float)(~uVar16 & auVar22._0_4_ | uVar16 & 0xbf800000);
    uVar18 = ~uVar18 & auVar22._4_4_ | uVar18 & 0xbf800000;
    uVar16 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)-fVar23);
    uVar17 = -(uint)((int)-fVar28 < (int)-fVar24) -
             ((int)fVar24 - (int)fVar28 ^ -(uint)((int)-fVar28 < (int)-fVar24));
    uVar16 = uVar16 - ((int)fVar23 - uVar18 ^ uVar16);
    auVar22._0_4_ = -(uint)(-0x7fffffff < (int)(uVar17 ^ 0x80000000));
    auVar22._4_4_ = -(uint)(-0x7fffffff < (int)(uVar17 ^ 0x80000000));
    auVar22._8_4_ = -(uint)(-0x7fffffff < (int)(uVar16 ^ 0x80000000));
    auVar22._12_4_ = -(uint)(-0x7fffffff < (int)(uVar16 ^ 0x80000000));
    uVar17 = movmskpd((int)outputs.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,auVar22);
    if ((((uVar17 & 2) != 0) || ((uVar17 & 1) != 0)) ||
       (1 < (-(uint)((int)-fVar4 < (int)-fVar25) -
             ((int)fVar25 - (int)fVar4 ^ -(uint)((int)-fVar4 < (int)-fVar25)) |
            -(uint)((int)-fVar5 < (int)-fVar27) -
            ((int)fVar27 - (int)fVar5 ^ -(uint)((int)-fVar5 < (int)-fVar27))))) {
      if (iVar12 < 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar13);
        std::operator<<((ostream *)local_1a8,",\n");
        std::operator<<((ostream *)local_1a8,"  expected unpackSnorm4x8(");
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13];
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,") = ");
        std::operator<<((ostream *)local_1a8,"vec4(");
        out = (void *)CONCAT44(out._4_4_,uVar18);
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,(HexFloat *)&out);
        std::operator<<((ostream *)local_1a8,", ");
        local_244.value = fVar28;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_244);
        std::operator<<((ostream *)local_1a8,", ");
        local_248.value = fVar25;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_248);
        std::operator<<((ostream *)local_1a8,", ");
        local_24c.value = fVar27;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_24c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,", got vec4(");
        local_250.value = fVar23;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_250);
        std::operator<<((ostream *)local_1a8,", ");
        local_254.value = fVar24;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_254);
        std::operator<<((ostream *)local_1a8,", ");
        local_258.value = fVar4;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_258);
        std::operator<<((ostream *)local_1a8,", ");
        local_25c.value = fVar5;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_25c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,"\n  ULP diffs = (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (iVar12 == 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      iVar12 = iVar12 + 1;
      puVar7 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    lVar14 = lVar14 + 0x10;
  }
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar10 = (int)(uVar9 >> 2);
  std::ostream::operator<<(local_1a8,iVar10 - iVar12);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar10);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (iVar12 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&in,"Pass",(allocator<char> *)&out)
    ;
    pTVar11 = local_240;
    tcu::TestStatus::pass(local_240,(string *)&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,"Result comparison failed",(allocator<char> *)&out);
    pTVar11 = local_240;
    tcu::TestStatus::fail(local_240,(string *)&in);
  }
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return pTVar11;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt8	in0		= (deInt8)(deUint8)(inputs[valNdx] & 0xff);
				const deInt8	in1		= (deInt8)(deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deInt8	in2		= (deInt8)(deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deInt8	in3		= (deInt8)(deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 127.f, -1.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 127.f, -1.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 127.f, -1.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 127.f, -1.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}